

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.cpp
# Opt level: O1

void ZiAllocScratchs(hs_database_t *db,hs_scratch_t **sc,int sc_len,char *info)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  long lVar4;
  
  *sc = (hs_scratch_t *)0x0;
  iVar1 = hs_alloc_scratch();
  if (iVar1 != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"[ ERROR ] ");
    poVar2 = std::operator<<(poVar2,info);
    pcVar3 = " HS-Alloc Failed: ";
LAB_0010491e:
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
    std::endl<char,std::char_traits<char>>(poVar2);
    exit(-1);
  }
  if (1 < sc_len) {
    lVar4 = 8;
    do {
      iVar1 = hs_clone_scratch(*sc,(long)sc + lVar4);
      if (iVar1 != 0) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"[ ERROR ] ");
        poVar2 = std::operator<<(poVar2,info);
        pcVar3 = " HS-Clone Failed: ";
        goto LAB_0010491e;
      }
      lVar4 = lVar4 + 8;
    } while ((ulong)(uint)sc_len << 3 != lVar4);
  }
  return;
}

Assistant:

void ZiAllocScratchs(const hs_database_t* db, hs_scratch_t** sc, int sc_len,
    const char* info)
{
    hs_error_t err;

    sc[0] = nullptr;
    err = hs_alloc_scratch(db, &sc[0]);
    if (err != HS_SUCCESS)
    {
        cerr << "[ ERROR ] " << info << " HS-Alloc Failed: " << err << endl;
        exit(-1);
    }

    for (int i = 1; i < sc_len; i++)
    {
        err = hs_clone_scratch(sc[0], &sc[i]);
        if (err != HS_SUCCESS)
        {
            cerr << "[ ERROR ] " << info << " HS-Clone Failed: " << err << endl;
            exit(-1);
        }
    }
}